

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,4,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,4,2>,tcu::Matrix<float,4,2>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  undefined8 *puVar1;
  bool *pbVar2;
  ostringstream *poVar3;
  _Rb_tree_node_base *p_Var4;
  Variable<tcu::Matrix<float,_4,_2>_> *pVVar5;
  pointer pcVar6;
  double dVar7;
  undefined8 uVar8;
  PrecisionCase *pPVar9;
  FloatFormat *fmt;
  pointer pSVar10;
  bool bVar11;
  bool bVar12;
  ContextType type;
  int iVar13;
  _Rb_tree_node_base *p_Var14;
  char *pcVar15;
  size_t sVar16;
  long *plVar17;
  ShaderExecutor *pSVar18;
  Interval *pIVar19;
  IVal *pIVar20;
  MessageBuilder *pMVar21;
  TestError *this_00;
  uint uVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  undefined1 *puVar24;
  Matrix<float,_4,_2> *pMVar25;
  long lVar26;
  size_t size;
  ulong uVar27;
  long lVar28;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>_>_>
  *pVVar29;
  IVal in2;
  IVal in3;
  ostringstream os;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>_>_>
  outputs;
  Environment env;
  IVal in1;
  ShaderSpec spec;
  FloatFormat highpFmt;
  ostringstream oss;
  FuncSet funcs;
  PrecisionCase *local_648;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>_>_>
  *local_640;
  Matrix<float,_4,_2> *local_638;
  string local_630;
  Statement *local_610;
  ulong local_608;
  string local_600;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_5e0;
  ResultCollector *local_5d8;
  FloatFormat *local_5d0;
  undefined1 local_5c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b8;
  double local_5a8;
  Data local_5a0;
  undefined4 local_590;
  ios_base local_558 [8];
  ios_base local_550 [272];
  size_t local_440;
  ulong local_438;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>_>_>
  local_430;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_400;
  IVal *local_3d0;
  long local_3c8;
  undefined1 local_3c0 [184];
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  local_308;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  vStack_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  undefined8 local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  undefined8 local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  FloatFormat local_298;
  undefined1 local_268 [112];
  ios_base local_1f8 [264];
  undefined1 local_f0 [16];
  _Base_ptr local_e0;
  _Rb_tree_node_base *local_d8;
  _Rb_tree_node_base *local_d0;
  double local_c8;
  
  local_638 = (inputs->in0).
              super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pMVar25 = (inputs->in0).
            super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  size = (long)pMVar25 - (long)local_638 >> 5;
  local_640 = variables;
  local_610 = stmt;
  local_5e0 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>_>_>
  ::Outputs(&local_430,size);
  local_2d8 = &local_2c8;
  local_3c0._176_4_ = 1;
  local_308.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_2f0.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_2f0.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_2f0.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d0 = 0;
  local_2c8._M_local_buf[0] = '\0';
  local_2b8 = &local_2a8;
  local_2b0 = 0;
  local_2a8._M_local_buf[0] = '\0';
  local_298.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_298.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_298.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_298.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_298.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_298.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_298.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_298.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_298._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_400._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_400._M_impl.super__Rb_tree_header._M_header;
  local_400._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_400._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_400._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5c8._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_5c8 + 8);
  local_400._M_impl.super__Rb_tree_header._M_header._M_right =
       local_400._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  (*local_610->_vptr_Statement[2])(local_610,poVar3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_5c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_550);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
  p_Var4 = (_Rb_tree_node_base *)(local_f0 + 8);
  local_f0._8_4_ = _S_red;
  local_e0 = (_Base_ptr)0x0;
  local_c8 = 0.0;
  local_648 = this;
  local_d8 = p_Var4;
  local_d0 = p_Var4;
  (*local_610->_vptr_Statement[4])(local_610,local_f0);
  if (local_d8 != p_Var4) {
    p_Var14 = local_d8;
    do {
      (**(code **)(**(long **)(p_Var14 + 1) + 0x30))(*(long **)(p_Var14 + 1),local_268);
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != p_Var4);
  }
  if (local_c8 != 0.0) {
    local_5c8._0_8_ = ((local_648->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_5c8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,(char *)local_3d0,local_3c8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_3d0 != (IVal *)local_3c0) {
      operator_delete(local_3d0,local_3c0._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_550);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
  std::ios_base::~ios_base(local_1f8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5c8,"precision ",10);
  pcVar15 = glu::getPrecisionName((local_648->m_ctx).precision);
  if (pcVar15 == (char *)0x0) {
    std::ios::clear((int)((long)&local_648 + *(long *)(local_5c8._0_8_ + -0x18)) + 0x80);
  }
  else {
    sVar16 = strlen(pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5c8,pcVar15,sVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5c8," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2d8,(string *)local_268);
  pcVar6 = local_268 + 0x10;
  if ((pointer)local_268._0_8_ != pcVar6) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c8);
  std::ios_base::~ios_base(local_558);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_648->m_ctx).renderContext)->_vptr_RenderContext[2])();
  pVVar29 = local_640;
  local_3c0._176_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_648->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                   "#extension ",&local_648->m_extension);
    plVar17 = (long *)std::__cxx11::string::append(local_268);
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar17 == paVar23) {
      local_5b8._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_5b8._8_8_ = plVar17[3];
      local_5c8._0_8_ = &local_5b8;
    }
    else {
      local_5b8._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_5c8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar17;
    }
    local_5c8._8_8_ = plVar17[1];
    *plVar17 = (long)paVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_2d8,(string *)local_5c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8._0_8_ != &local_5b8) {
      operator_delete((void *)local_5c8._0_8_,local_5b8._M_allocated_capacity + 1);
    }
    pVVar29 = local_640;
    if ((pointer)local_268._0_8_ != pcVar6) {
      operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize(&local_308,1);
  makeSymbol<tcu::Matrix<float,4,2>>
            ((Symbol *)local_5c8,local_648,
             (pVVar29->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
             .m_ptr);
  pSVar10 = local_308.
            super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=
            ((string *)
             local_308.
             super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             ._M_impl.super__Vector_impl_data._M_start,(string *)local_5c8);
  glu::VarType::operator=(&pSVar10->varType,(VarType *)&local_5a8);
  glu::VarType::~VarType((VarType *)&local_5a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._0_8_ != &local_5b8) {
    operator_delete((void *)local_5c8._0_8_,local_5b8._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize(&vStack_2f0,2);
  makeSymbol<tcu::Matrix<float,4,2>>
            ((Symbol *)local_5c8,local_648,
             (local_640->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
             .m_ptr);
  pSVar10 = vStack_2f0.
            super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=
            ((string *)
             (vStack_2f0.
              super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start + 1),(string *)local_5c8);
  glu::VarType::operator=(&pSVar10[1].varType,(VarType *)&local_5a8);
  glu::VarType::~VarType((VarType *)&local_5a8);
  pVVar29 = local_640;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._0_8_ != &local_5b8) {
    operator_delete((void *)local_5c8._0_8_,local_5b8._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Matrix<float,4,2>>
            ((Symbol *)local_5c8,local_648,
             (pVVar29->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
             .m_ptr);
  pSVar10 = vStack_2f0.
            super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=
            ((string *)
             vStack_2f0.
             super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             ._M_impl.super__Vector_impl_data._M_start,(string *)local_5c8);
  glu::VarType::operator=(&pSVar10->varType,(VarType *)&local_5a8);
  glu::VarType::~VarType((VarType *)&local_5a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._0_8_ != &local_5b8) {
    operator_delete((void *)local_5c8._0_8_,local_5b8._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c8);
  (*local_610->_vptr_Statement[2])(local_610,local_5c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c8);
  std::ios_base::~ios_base(local_558);
  std::__cxx11::string::operator=((string *)&local_2b8,(string *)local_268);
  if ((pointer)local_268._0_8_ != pcVar6) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  pPVar9 = local_648;
  pSVar18 = ShaderExecUtil::createExecutor
                      ((local_648->m_ctx).renderContext,(local_648->m_ctx).shaderType,
                       (ShaderSpec *)(local_3c0 + 0xb0));
  local_5c8._0_8_ =
       (local_5e0->in0).
       super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_5c8._8_8_ =
       (local_5e0->in1).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_5b8._M_allocated_capacity =
       (size_type)
       (local_5e0->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_5b8._8_8_ =
       (local_5e0->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_268._0_8_ =
       local_430.out0.
       super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_268._8_8_ =
       local_430.out1.
       super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (*pSVar18->_vptr_ShaderExecutor[3])
            (pSVar18,((pPVar9->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar13 = (*pSVar18->_vptr_ShaderExecutor[2])(pSVar18);
  if ((char)iVar13 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar18->_vptr_ShaderExecutor[5])(pSVar18);
  (*pSVar18->_vptr_ShaderExecutor[6])(pSVar18,size & 0xffffffff,local_5c8,local_268);
  (*pSVar18->_vptr_ShaderExecutor[1])(pSVar18);
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_5c8);
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_268);
  pVVar29 = local_640;
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_f0);
  Environment::bind<tcu::Matrix<float,4,2>>
            ((Environment *)&local_400,
             (pVVar29->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
             .m_ptr,(IVal *)local_5c8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_400,
             (pVVar29->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_3d0);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_400,
             (pVVar29->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_630);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_400,
             (pVVar29->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_600);
  Environment::bind<tcu::Matrix<float,4,2>>
            ((Environment *)&local_400,
             (pVVar29->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
             .m_ptr,(IVal *)local_268);
  Environment::bind<tcu::Matrix<float,4,2>>
            ((Environment *)&local_400,
             (pVVar29->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
             .m_ptr,(IVal *)local_f0);
  local_440 = size;
  if (pMVar25 == local_638) {
    local_608 = 0;
  }
  else {
    local_5d0 = &(local_648->m_ctx).floatFormat;
    local_5d8 = &local_648->m_status;
    local_438 = size + (size == 0);
    uVar27 = 0;
    local_608 = 0;
    do {
      tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_268);
      tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_f0);
      if ((uVar27 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_648->super_TestCase).super_TestNode.m_testCtx);
      }
      fmt = local_5d0;
      local_638 = (Matrix<float,_4,_2> *)(uVar27 * 0x20);
      round<tcu::Matrix<float,4,2>>
                ((IVal *)&local_3d0,(BuiltinPrecisionTests *)local_5d0,
                 (FloatFormat *)
                 ((long)(local_638->m_data).m_data[0].m_data +
                 (long)(local_5e0->in0).
                       super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start),local_638);
      pVVar29 = local_640;
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doConvert
                ((IVal *)local_5c8,fmt,(IVal *)&local_3d0);
      pIVar19 = (Interval *)
                Environment::lookup<tcu::Matrix<float,4,2>>
                          ((Environment *)&local_400,
                           (pVVar29->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
                           .m_ptr);
      lVar26 = 0;
      pMVar21 = (MessageBuilder *)local_5c8;
      do {
        lVar28 = 0;
        do {
          *(undefined8 *)((long)&pIVar19->m_hi + lVar28) =
               *(undefined8 *)(&pMVar21->field_0x10 + lVar28);
          puVar1 = (undefined8 *)((long)&pMVar21->m_log + lVar28);
          dVar7 = (double)puVar1[1];
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)&pIVar19->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar28;
          *(undefined8 *)pbVar2 = *puVar1;
          *(double *)(pbVar2 + 8) = dVar7;
          lVar28 = lVar28 + 0x60;
        } while (lVar28 == 0x60);
        lVar26 = lVar26 + 1;
        pIVar19 = pIVar19 + 1;
        pMVar21 = (MessageBuilder *)&pMVar21->field_0x18;
      } while (lVar26 != 4);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_400,
                 (pVVar29->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_400,
                 (pVVar29->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_400,
                 (pVVar29->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_5a0.basic.type = (local_648->m_ctx).precision;
      local_5a8 = local_5d0->m_maxValue;
      local_5c8._0_8_ = *(undefined8 *)local_5d0;
      local_5c8._8_8_ = *(undefined8 *)&local_5d0->m_fractionBits;
      local_5b8._M_allocated_capacity = *(undefined8 *)&local_5d0->m_hasInf;
      local_5b8._8_8_ = *(undefined8 *)&local_5d0->m_exactPrecision;
      local_590 = 0;
      local_5a0._8_8_ = &local_400;
      (*local_610->_vptr_Statement[3])(local_610,(MessageBuilder *)local_5c8);
      pIVar20 = Environment::lookup<tcu::Matrix<float,4,2>>
                          ((Environment *)&local_400,
                           (pVVar29->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doConvert
                ((IVal *)local_5c8,&local_298,pIVar20);
      puVar24 = local_f0;
      lVar26 = 0;
      pMVar21 = (MessageBuilder *)local_5c8;
      do {
        lVar28 = 0;
        do {
          *(undefined8 *)(puVar24 + lVar28 + 0x10) = *(undefined8 *)(&pMVar21->field_0x10 + lVar28);
          puVar1 = (undefined8 *)((long)&pMVar21->m_log + lVar28);
          uVar8 = puVar1[1];
          *(undefined8 *)(puVar24 + lVar28) = *puVar1;
          *(undefined8 *)((long)(puVar24 + lVar28) + 8) = uVar8;
          lVar28 = lVar28 + 0x60;
        } while (lVar28 == 0x60);
        lVar26 = lVar26 + 1;
        puVar24 = puVar24 + 0x18;
        pMVar21 = (MessageBuilder *)&pMVar21->field_0x18;
      } while (lVar26 != 4);
      bVar11 = contains<tcu::Matrix<float,4,2>>
                         ((IVal *)local_f0,
                          (Matrix<float,_4,_2> *)
                          ((long)(local_638->m_data).m_data[0].m_data +
                          (long)((local_430.out1.
                                  super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].
                                m_data));
      local_5c8._0_8_ = &local_5b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5c8,"Shader output 1 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check(local_5d8,bVar11,(string *)local_5c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c8._0_8_ != &local_5b8) {
        operator_delete((void *)local_5c8._0_8_,(ulong)(local_5b8._M_allocated_capacity + 1));
      }
      pIVar20 = Environment::lookup<tcu::Matrix<float,4,2>>
                          ((Environment *)&local_400,
                           (local_640->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doConvert
                ((IVal *)local_5c8,&local_298,pIVar20);
      puVar24 = local_268;
      lVar26 = 0;
      pMVar21 = (MessageBuilder *)local_5c8;
      do {
        lVar28 = 0;
        do {
          *(undefined8 *)(puVar24 + lVar28 + 0x10) = *(undefined8 *)(&pMVar21->field_0x10 + lVar28);
          puVar1 = (undefined8 *)((long)&pMVar21->m_log + lVar28);
          uVar8 = puVar1[1];
          *(undefined8 *)(puVar24 + lVar28) = *puVar1;
          *(undefined8 *)((long)(puVar24 + lVar28) + 8) = uVar8;
          lVar28 = lVar28 + 0x60;
        } while (lVar28 == 0x60);
        lVar26 = lVar26 + 1;
        puVar24 = puVar24 + 0x18;
        pMVar21 = (MessageBuilder *)&pMVar21->field_0x18;
      } while (lVar26 != 4);
      bVar12 = contains<tcu::Matrix<float,4,2>>
                         ((IVal *)local_268,
                          (Matrix<float,_4,_2> *)
                          ((long)(local_638->m_data).m_data[0].m_data +
                          (long)((local_430.out0.
                                  super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].
                                m_data));
      local_5c8._0_8_ = &local_5b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5c8,"Shader output 0 is outside acceptable range","");
      bVar12 = tcu::ResultCollector::check(local_5d8,bVar12,(string *)local_5c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c8._0_8_ != &local_5b8) {
        operator_delete((void *)local_5c8._0_8_,(ulong)(local_5b8._M_allocated_capacity + 1));
      }
      uVar22 = (int)local_608 + ((byte)~(bVar11 && bVar12) & 1);
      local_608 = (ulong)uVar22;
      poVar3 = (ostringstream *)(local_5c8 + 8);
      if ((int)uVar22 < 0x65 && (!bVar11 || !bVar12)) {
        local_5c8._0_8_ = ((local_648->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        pcVar15 = "Failed";
        if (bVar11 && bVar12) {
          pcVar15 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar15,6);
        pVVar29 = local_640;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar5 = (pVVar29->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
                 .m_ptr;
        pMVar25 = (Matrix<float,_4,_2> *)local_3c0;
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_3d0 = (IVal *)pMVar25;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3d0,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_3d0,local_3c8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Matrix<float,4,2>>
                  (&local_630,(BuiltinPrecisionTests *)&local_298,
                   (FloatFormat *)
                   ((long)(local_638->m_data).m_data[0].m_data +
                   (long)(local_5e0->in0).
                         super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_start),pMVar25);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,local_630._M_dataplus._M_p,local_630._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_630._M_dataplus._M_p != &local_630.field_2) {
          operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
        }
        if (local_3d0 != (IVal *)local_3c0) {
          operator_delete(local_3d0,local_3c0._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar5 = (pVVar29->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
                 .m_ptr;
        pIVar20 = (IVal *)local_3c0;
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_3d0 = pIVar20;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3d0,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_3d0,local_3c8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Matrix<float,4,2>>
                  (&local_630,(BuiltinPrecisionTests *)&local_298,
                   (FloatFormat *)
                   ((long)(local_638->m_data).m_data[0].m_data +
                   (long)((local_430.out0.
                           super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data),
                   (Matrix<float,_4,_2> *)pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,local_630._M_dataplus._M_p,local_630._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,4,2>>
                  (&local_600,(BuiltinPrecisionTests *)&local_298,(FloatFormat *)local_268,pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,local_600._M_dataplus._M_p,local_600._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_600._M_dataplus._M_p != &local_600.field_2) {
          operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_630._M_dataplus._M_p != &local_630.field_2) {
          operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
        }
        if (local_3d0 != (IVal *)local_3c0) {
          operator_delete(local_3d0,local_3c0._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar5 = (pVVar29->out1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
                 .m_ptr;
        pIVar20 = (IVal *)local_3c0;
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_3d0 = pIVar20;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3d0,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_3d0,local_3c8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Matrix<float,4,2>>
                  (&local_630,(BuiltinPrecisionTests *)&local_298,
                   (FloatFormat *)
                   ((long)((local_430.out1.
                            super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   (long)(local_638->m_data).m_data[0].m_data),(Matrix<float,_4,_2> *)pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,local_630._M_dataplus._M_p,local_630._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,4,2>>
                  (&local_600,(BuiltinPrecisionTests *)&local_298,(FloatFormat *)local_f0,pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,local_600._M_dataplus._M_p,local_600._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_600._M_dataplus._M_p != &local_600.field_2) {
          operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_630._M_dataplus._M_p != &local_630.field_2) {
          operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
        }
        if (local_3d0 != (IVal *)local_3c0) {
          operator_delete(local_3d0,local_3c0._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_5c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base(local_550);
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 != local_438);
  }
  iVar13 = (int)local_608;
  if (100 < iVar13) {
    local_5c8._0_8_ = ((local_648->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_5c8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
    std::ostream::operator<<(poVar3,iVar13 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_550);
  }
  if (iVar13 == 0) {
    local_5c8._0_8_ = ((local_648->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_5c8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_5c8._0_8_ = ((local_648->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_5c8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,iVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_5c8 + 8));
  std::ios_base::~ios_base(local_550);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_400);
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,
                    CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,
                    CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector(&vStack_2f0);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector(&local_308);
  if (local_430.out1.
      super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_430.out1.
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_430.out1.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_430.out1.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_430.out0.
      super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_430.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_430.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_430.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}